

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_oct(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  uint uVar1;
  undefined1 n [16];
  anon_class_16_2_cb75083a_for_f_conflict1 f;
  int num_digits_00;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar2;
  string_view prefix;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uStack_4c;
  int num_digits;
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
  *this_local;
  
  n._8_8_ = in_stack_ffffffffffffff90;
  n._0_8_ = in_stack_ffffffffffffff88;
  num_digits_00 =
       count_digits<3u,unsigned__int128>(*(detail **)&this->abs_value,(unsigned___int128)n);
  if ((((char)this->specs->field_0x9 < '\0') && (this->specs->precision <= num_digits_00)) &&
     ((long)this->abs_value != 0 || *(long *)((long)&this->abs_value + 8) != 0)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  bVar2.container = (this->out).container;
  prefix = get_prefix(this);
  f._12_4_ = uStack_4c;
  f.num_digits = num_digits_00;
  f.this = this;
  bVar2 = write_int<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>::on_oct()::_lambda(char*)_1_>
                    (bVar2,num_digits_00,prefix,this->specs,f);
  (this->out).container = bVar2.container;
  return;
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }